

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int fits_quantize_double
              (long row,double *fdata,long nxpix,long nypix,int nullcheck,double in_null_value,
              float qlevel,int dither_method,int *idata,double *bscale,double *bzero,int *iminval,
              int *imaxval)

{
  double *minval_00;
  double *in_RCX;
  long in_RDX;
  int *unaff_RBX;
  long in_RSI;
  double *in_RDI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar1;
  float in_XMM1_Da;
  long in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  long *in_stack_00000020;
  int *in_stack_00000028;
  int in_stack_00000034;
  long in_stack_00000038;
  LONGLONG iqfactor;
  double *in_stack_00000048;
  int nextrand;
  double temp;
  double zeropt;
  double delta;
  double maxval;
  double minval;
  double noise5;
  double noise3;
  double noise2;
  double stdev;
  long ngood;
  long nx;
  long i;
  int iseed;
  int status;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_bc;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_78;
  long *in_stack_ffffffffffffffa0;
  long lVar2;
  int iVar3;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar3 = 0;
  local_a0 = 0.0;
  local_bc = 0;
  minval_00 = (double *)(in_RDX * (long)in_RCX);
  if ((long)minval_00 < 2) {
    *in_stack_00000010 = 1.0;
    *in_stack_00000018 = 0.0;
    iVar3 = 0;
  }
  else {
    if (in_XMM1_Da < 0.0) {
      local_a8 = (double)-in_XMM1_Da;
      FnNoise3_double(in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffc0),(long)in_XMM0_Qa,
                      (int)in_XMM1_Da,(double)((ulong)in_stack_ffffffffffffffac << 0x20),
                      in_stack_ffffffffffffffa0,minval_00,in_RDI,
                      (double *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      unaff_RBX);
    }
    else {
      FnNoise5_double(in_stack_00000048,iqfactor,in_stack_00000038,in_stack_00000034,
                      (double)in_stack_00000028,in_stack_00000020,in_stack_00000018,(double *)delta,
                      (double *)maxval,(double *)minval,(double *)noise5,(int *)noise3);
      if (in_R8D == 0) {
        local_78 = 0.0;
      }
      else {
        local_a0 = 1.0;
        local_78 = 1.0;
      }
      if ((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) {
        local_a8 = local_78 / (double)in_XMM1_Da;
      }
      else {
        local_a8 = local_78 / 4.0;
      }
      if ((local_a8 == 0.0) && (!NAN(local_a8))) {
        return 0;
      }
    }
    if ((local_a0 - 0.0) / local_a8 <= 4294967284.0) {
      if (0 < (long)in_RDI) {
        if ((fits_rand_value == (float *)0x0) && (iVar3 = fits_init_randoms(), iVar3 != 0)) {
          return 0x71;
        }
        iVar3 = (int)(((long)in_RDI + -1) % 10000);
        local_bc = (int)(fits_rand_value[iVar3] * 500.0);
      }
      if (minval_00 == (double *)0x0) {
        if (in_R9D == 2) {
          local_b0 = -local_a8 * -2147483637.0 + 0.0;
        }
        else if (2147483637.0 <= (local_a0 - 0.0) / local_a8) {
          local_b0 = (local_a0 + 0.0) / 2.0;
        }
        else {
          local_b0 = (double)(long)(0.0 / local_a8 + 0.5) * local_a8;
        }
        if ((long)in_RDI < 1) {
          for (lVar2 = 0; lVar2 < 0; lVar2 = lVar2 + 1) {
            if ((*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 < 0.0) {
              dVar1 = (*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 - 0.5;
            }
            else {
              dVar1 = (*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 + 0.5;
            }
            local_d0 = (int)dVar1;
            *(int *)(in_stack_00000008 + lVar2 * 4) = local_d0;
          }
        }
        else {
          for (lVar2 = 0; lVar2 < 0; lVar2 = lVar2 + 1) {
            if (((in_R9D != 2) || (dVar1 = *(double *)(in_RSI + lVar2 * 8), dVar1 != 0.0)) ||
               (NAN(dVar1))) {
              if (((*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 +
                  (double)fits_rand_value[local_bc]) - 0.5 < 0.0) {
                dVar1 = (((*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 +
                         (double)fits_rand_value[local_bc]) - 0.5) - 0.5;
              }
              else {
                dVar1 = (((*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 +
                         (double)fits_rand_value[local_bc]) - 0.5) + 0.5;
              }
              local_cc = (int)dVar1;
              *(int *)(in_stack_00000008 + lVar2 * 4) = local_cc;
            }
            else {
              *(undefined4 *)(in_stack_00000008 + lVar2 * 4) = 0x80000002;
            }
            local_bc = local_bc + 1;
            if (local_bc == 10000) {
              iVar3 = iVar3 + 1;
              if (iVar3 == 10000) {
                iVar3 = 0;
              }
              local_bc = (int)(fits_rand_value[iVar3] * 500.0);
            }
          }
        }
      }
      else {
        local_b0 = -local_a8 * -2147483637.0 + 0.0;
        if ((long)in_RDI < 1) {
          for (lVar2 = 0; lVar2 < (long)minval_00; lVar2 = lVar2 + 1) {
            dVar1 = *(double *)(in_RSI + lVar2 * 8);
            if ((dVar1 != in_XMM0_Qa) || (NAN(dVar1) || NAN(in_XMM0_Qa))) {
              if ((*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 < 0.0) {
                dVar1 = (*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 - 0.5;
              }
              else {
                dVar1 = (*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 + 0.5;
              }
              local_d8 = (int)dVar1;
              *(int *)(in_stack_00000008 + lVar2 * 4) = local_d8;
            }
            else {
              *(undefined4 *)(in_stack_00000008 + lVar2 * 4) = 0x80000001;
            }
          }
        }
        else {
          for (lVar2 = 0; lVar2 < (long)minval_00; lVar2 = lVar2 + 1) {
            dVar1 = *(double *)(in_RSI + lVar2 * 8);
            if ((dVar1 != in_XMM0_Qa) || (NAN(dVar1) || NAN(in_XMM0_Qa))) {
              if ((in_R9D != 2) ||
                 ((dVar1 = *(double *)(in_RSI + lVar2 * 8), dVar1 != 0.0 || (NAN(dVar1))))) {
                if (((*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 +
                    (double)fits_rand_value[local_bc]) - 0.5 < 0.0) {
                  dVar1 = (((*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 +
                           (double)fits_rand_value[local_bc]) - 0.5) - 0.5;
                }
                else {
                  dVar1 = (((*(double *)(in_RSI + lVar2 * 8) - local_b0) / local_a8 +
                           (double)fits_rand_value[local_bc]) - 0.5) + 0.5;
                }
                local_d4 = (int)dVar1;
                *(int *)(in_stack_00000008 + lVar2 * 4) = local_d4;
              }
              else {
                *(undefined4 *)(in_stack_00000008 + lVar2 * 4) = 0x80000002;
              }
            }
            else {
              *(undefined4 *)(in_stack_00000008 + lVar2 * 4) = 0x80000001;
            }
            local_bc = local_bc + 1;
            if (local_bc == 10000) {
              iVar3 = iVar3 + 1;
              if (iVar3 == 10000) {
                iVar3 = 0;
              }
              local_bc = (int)(fits_rand_value[iVar3] * 500.0);
            }
          }
        }
      }
      dVar1 = (0.0 - local_b0) / local_a8;
      if (dVar1 < 0.0) {
        dVar1 = dVar1 - 0.5;
      }
      else {
        dVar1 = dVar1 + 0.5;
      }
      local_dc = (int)dVar1;
      *(int *)in_stack_00000020 = local_dc;
      dVar1 = (local_a0 - local_b0) / local_a8;
      if (dVar1 < 0.0) {
        dVar1 = dVar1 - 0.5;
      }
      else {
        dVar1 = dVar1 + 0.5;
      }
      local_e0 = (int)dVar1;
      *in_stack_00000028 = local_e0;
      *in_stack_00000010 = local_a8;
      *in_stack_00000018 = local_b0;
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int fits_quantize_double (long row, double fdata[], long nxpix, long nypix, int nullcheck, 
	double in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: tile number = row number in the binary table
                       (this is only used when dithering the quantized values)
double fdata[]      i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
double in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2 = 0., noise3 = 0., noise5 = 0.;	/* MAD 2nd, 3rd, and 5th order noise values */
	double minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value;
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_double(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_double(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	       if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
       	      for (i = 0;  i < nx;  i++) {

		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
                    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
                 if (fdata[i] != in_null_value)
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 else 
                    idata[i] = NULL_VALUE;
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;

	return (1);			/* yes, data have been quantized */
}